

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwGetWindowPos(GLFWwindow *handle,int *xpos,int *ypos)

{
  _GLFWwindow *window;
  int iStack_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  long lStack_30;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  XTranslateCoordinates
            (_glfw.x11.display,*(undefined8 *)(handle + 0x270),_glfw.x11.root,0,0,&iStack_3c,
             &iStack_40,&lStack_30);
  if (lStack_30 != 0) {
    XTranslateCoordinates
              (_glfw.x11.display,*(undefined8 *)(handle + 0x270),lStack_30,0,0,&iStack_34,&iStack_38
               ,&lStack_30);
    iStack_3c = iStack_3c - iStack_34;
    iStack_40 = iStack_40 - iStack_38;
  }
  if (xpos != (int *)0x0) {
    *xpos = iStack_3c;
  }
  if (ypos != (int *)0x0) {
    *ypos = iStack_40;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowPos(GLFWwindow* handle, int* xpos, int* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowPos(window, xpos, ypos);
}